

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O1

BOOL __thiscall LASinterval::has_intervals(LASinterval *this)

{
  LASintervalCell *pLVar1;
  
  pLVar1 = this->current_cell;
  if (pLVar1 != (LASintervalCell *)0x0) {
    this->start = pLVar1->start;
    this->end = pLVar1->end;
    this->current_cell = pLVar1->next;
  }
  return pLVar1 != (LASintervalCell *)0x0;
}

Assistant:

BOOL LASinterval::has_intervals()
{
  if (current_cell)
  {
    start = current_cell->start;
    end = current_cell->end;
    current_cell = current_cell->next;
    return TRUE;
  }
  return FALSE;
}